

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int steedintrap(trap *trap,obj *otmp)

{
  permonst *ppVar1;
  monst *mon;
  byte bVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  int tlev;
  char *line;
  bool bVar7;
  
  mon = u.usteed;
  iVar5 = 0;
  if (trap == (trap *)0x0 || u.usteed == (monst *)0x0) {
    return 0;
  }
  ppVar1 = (u.usteed)->data;
  bVar2 = trap->field_0x8 & 0x1f;
  (u.usteed)->mx = u.ux;
  mon->my = u.uy;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026649b;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00266496;
    bVar7 = false;
  }
  else {
LAB_00266496:
    if (ublindf == (obj *)0x0) {
      bVar7 = true;
    }
    else {
LAB_0026649b:
      bVar7 = ublindf->oartifact != '\x1d';
    }
  }
  switch(bVar2) {
  case 1:
    if (otmp == (obj *)0x0) {
      impossible("steed hit by non-existant arrow?");
      return 0;
    }
    tlev = 8;
    goto LAB_002665b7;
  case 2:
    goto switchD_002664e0_caseD_2;
  case 3:
  case 4:
  case 5:
  case 7:
  case 9:
  case 10:
    goto switchD_002664e0_caseD_3;
  case 6:
    uVar4 = mt_random();
    uVar4 = uVar4 & 0xf;
LAB_002665c9:
    iVar5 = uVar4 + 1;
    tlev = 0;
    otmp = (obj *)0x0;
    goto LAB_002665d0;
  case 8:
    if ((mon->mintrinsics & 4) != 0) {
      return 1;
    }
    if ((ppVar1->mflags1 & 0x400) != 0) {
      return 1;
    }
    if ((*(uint *)&mon->field_0x60 & 0xc0000) != 0x40000) {
      return 1;
    }
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff3ffff;
    uVar4 = mt_random();
    mon->mfrozen = (char)uVar4 + (char)(uVar4 / 0x19) * -0x19 + '\x01';
    if (bVar7) {
      return 1;
    }
    pcVar6 = Monnam(mon);
    line = "%s suddenly falls asleep!";
LAB_0026667f:
    pline(line,pcVar6);
    return 1;
  case 0xb:
  case 0xc:
    if (0 < mon->mhp) {
      uVar4 = mt_random();
      uVar4 = uVar4 % ((uint)(bVar2 != 0xb) * 4 + 6);
      goto LAB_002665c9;
    }
    goto LAB_002665dc;
  default:
    if (bVar2 == 0x17) {
      bVar3 = resists_magm(mon);
      if (bVar3 != '\0') {
        return 0;
      }
      iVar5 = resist(mon,'\v',0,0);
      if (iVar5 != 0) {
        return 1;
      }
      newcham(level,mon,(permonst *)0x0,'\0','\0');
      bVar3 = can_saddle(mon);
      if ((bVar3 == '\0') || (bVar3 = can_ride(mon), bVar3 == '\0')) {
        dismount_steed(3);
        return 1;
      }
      pcVar6 = x_monnam(mon,(uint)(mon->mnamelth == '\0') * 2,(char *)0x0,8,'\0');
      line = "You have to adjust yourself in the saddle on %s.";
      goto LAB_0026667f;
    }
    if (bVar2 != 0x18) {
      return 0;
    }
switchD_002664e0_caseD_2:
    if (otmp == (obj *)0x0) {
      pcVar6 = "dart";
      if (bVar2 == 0x18) {
        pcVar6 = "shuriken";
      }
      iVar5 = 0;
      impossible("steed hit by non-existant %s?",pcVar6);
    }
    else {
      tlev = 7;
LAB_002665b7:
      iVar5 = 0;
LAB_002665d0:
      bVar3 = thitm(tlev,mon,otmp,iVar5,'\0');
      if (bVar3 == '\0') {
        iVar5 = 1;
      }
      else {
LAB_002665dc:
        dismount_steed(3);
        iVar5 = 2;
      }
    }
switchD_002664e0_caseD_3:
    return iVar5;
  }
}

Assistant:

static int steedintrap(struct trap *trap, struct obj *otmp)
{
	struct monst *mtmp = u.usteed;
	const struct permonst *mptr;
	int tt;
	boolean in_sight;
	boolean trapkilled = FALSE;
	boolean steedhit = FALSE;

	if (!u.usteed || !trap) return 0;
	mptr = mtmp->data;
	tt = trap->ttyp;
	mtmp->mx = u.ux;
	mtmp->my = u.uy;

	in_sight = !Blind;
	switch (tt) {
		case ARROW_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant arrow?");
				return 0;
			}
			if (thitm(8, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case DART_TRAP:
		case SHURIKEN_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant %s?",
					   tt == SHURIKEN_TRAP ? "shuriken" : "dart");
				return 0;
			}
			if (thitm(7, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case SLP_GAS_TRAP:
		    if (!resists_sleep(mtmp) && !breathless(mptr) &&
				!mtmp->msleeping && mtmp->mcanmove) {
			    mtmp->mcanmove = 0;
			    mtmp->mfrozen = rnd(25);
			    if (in_sight) {
				pline("%s suddenly falls asleep!",
				      Monnam(mtmp));
			    }
			}
			steedhit = TRUE;
			break;
		case LANDMINE:
			if (thitm(0, mtmp, NULL, rnd(16), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case PIT:
		case SPIKED_PIT:
			if (mtmp->mhp <= 0 ||
				thitm(0, mtmp, NULL,
				      rnd((tt == PIT) ? 6 : 10), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case POLY_TRAP: 
		    if (!resists_magm(mtmp)) {
			if (!resist(mtmp, WAND_CLASS, 0, NOTELL)) {
				newcham(level, mtmp, NULL,
					       FALSE, FALSE);
			if (!can_saddle(mtmp) || !can_ride(mtmp)) {
				dismount_steed(DISMOUNT_POLY);
			} else {
				pline("You have to adjust yourself in the saddle on %s.",
					x_monnam(mtmp,
					 mtmp->mnamelth ? ARTICLE_NONE : ARTICLE_A,
				 	 NULL, SUPPRESS_SADDLE, FALSE));
			}
				
		    }
		    steedhit = TRUE;
		    break;
		default:
			return 0;
	    }
	}
	if (trapkilled) {
		dismount_steed(DISMOUNT_POLY);
		return 2;
	}
	else if (steedhit) return 1;
	else return 0;
}